

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

bool_t ReadHex(tchar_t **p,intptr_t *Out,bool_t RGB,bool_t Neg)

{
  int iVar1;
  tchar_t *ptVar2;
  undefined8 local_50;
  size_t n;
  intptr_t w;
  intptr_t v;
  tchar_t *s;
  bool_t Neg_local;
  bool_t RGB_local;
  intptr_t *Out_local;
  tchar_t **p_local;
  
  v = (intptr_t)*p;
  w = 0;
  local_50 = 0;
  iVar1 = Hex((int)*(char *)v);
  n = (size_t)iVar1;
  if ((long)n < 0) {
    p_local = (tchar_t **)0x0;
  }
  else {
    do {
      local_50 = local_50 + 1;
      w = w * 0x10 + n;
      ptVar2 = (tchar_t *)(v + 1);
      iVar1 = Hex((int)*(char *)(v + 1));
      n = (size_t)iVar1;
      v = (intptr_t)ptVar2;
    } while (-1 < (long)n);
    if (RGB != 0) {
      if (local_50 < 7) {
        w = w * 0x100;
      }
      w = (intptr_t)
          ((uint)((ulong)w >> 0x18) & 0xff | (uint)((ulong)w >> 8) & 0xff00 |
           ((uint)w & 0xff00) << 8 | (uint)w << 0x18);
    }
    if (Neg != 0) {
      w = -w;
    }
    *Out = w;
    *p = ptVar2;
    p_local = (tchar_t **)0x1;
  }
  return (bool_t)p_local;
}

Assistant:

static NOINLINE bool_t ReadHex(const tchar_t** p,intptr_t* Out,bool_t RGB, bool_t Neg)
{
    const tchar_t* s = *p;
    intptr_t v = 0;
    intptr_t w;
    size_t n = 0;

    if ((w = Hex(*s))<0)
        return 0;

    do
    {
        ++n;
        v = v*16+w;
    } while ((w = Hex(*(++s)))>=0);

    if (RGB)
    {
        if (n<=6)
            v <<= 8;
        v = INT32BE(v);
    }

    if (Neg)
        v = -v;

    *Out = v;
    *p = s;
    return 1;
}